

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

attr_list INT_EVdfg_get_attr_list(EVdfg_stone stone)

{
  EVdfg_stone_state p_Var1;
  long *in_RDI;
  EVdfg_stone_state wstone;
  EVdfg_stone_state dstone;
  attr_list local_8;
  
  if ((*(long *)(*in_RDI + 0x30) == 0) ||
     (p_Var1 = find_stone_state((int)in_RDI[1],*(EVdfg_configuration *)(*in_RDI + 0x30)),
     p_Var1 == (EVdfg_stone_state)0x0)) {
    if ((*(long *)(*in_RDI + 0x38) == 0) ||
       (p_Var1 = find_stone_state((int)in_RDI[1],*(EVdfg_configuration *)(*in_RDI + 0x30)),
       p_Var1 == (EVdfg_stone_state)0x0)) {
      local_8 = (attr_list)0x0;
    }
    else {
      if (p_Var1->attrs != (attr_list)0x0) {
        add_ref_attr_list(p_Var1->attrs);
      }
      local_8 = p_Var1->attrs;
    }
  }
  else {
    if (p_Var1->attrs != (attr_list)0x0) {
      add_ref_attr_list(p_Var1->attrs);
    }
    local_8 = p_Var1->attrs;
  }
  return local_8;
}

Assistant:

extern attr_list
INT_EVdfg_get_attr_list(EVdfg_stone stone)
{
    if (stone->dfg->deployed_state) {
	EVdfg_stone_state dstone = find_stone_state(stone->stone_id, stone->dfg->deployed_state);
	if (dstone) {
	    if (dstone->attrs) add_ref_attr_list(dstone->attrs);
	    return dstone->attrs;
	}
    }
    if (stone->dfg->working_state) {
	EVdfg_stone_state wstone = find_stone_state(stone->stone_id, stone->dfg->deployed_state);
	if (wstone) {
	    if (wstone->attrs) add_ref_attr_list(wstone->attrs);
	    return wstone->attrs;
	}
    }	
    return NULL;
}